

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpBrReg2<Js::OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  short sVar1;
  uint uVar2;
  
  sVar1 = data->RelativeJumpOffset;
  uVar2 = ByteCodeReader::GetCurrentOffset(reader);
  Output::Print(L" x:%04x (%4d) ",(ulong)(uVar2 + (int)sVar1),(ulong)(uint)(int)sVar1);
  Output::Print(L" R%d ",(ulong)data->R1);
  Output::Print(L" R%d ",(ulong)data->R2);
  return;
}

Assistant:

void ByteCodeDumper::DumpBrReg2(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpOffset(data->RelativeJumpOffset, reader);
        DumpReg(data->R1);
        DumpReg(data->R2);
    }